

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void collectCustomLayerNamesAndDescriptions
               (Model *model,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *output)

{
  int iVar1;
  bool bVar2;
  TypeCase TVar3;
  int iVar4;
  LayerCase LVar5;
  Pipeline *pPVar6;
  RepeatedPtrField<CoreML::Specification::Model> *pRVar7;
  reference pMVar8;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  CustomLayerParams *pCVar9;
  string *__x;
  string *__y;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  NeuralNetworkLayer *local_90;
  NeuralNetworkLayer *layer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *pRStack_80;
  int i;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers;
  Model *m_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_2;
  Model *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_1;
  Model *m;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *output_local;
  Model *model_local;
  
  TVar3 = CoreML::Specification::Model::Type_case(model);
  if (TVar3 == kPipelineClassifier) {
    this_00 = CoreML::Specification::Model::pipelineclassifier(model);
    pPVar6 = CoreML::Specification::PipelineClassifier::pipeline(this_00);
    pRVar7 = CoreML::Specification::Pipeline::models(pPVar6);
    __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar7);
    m_2 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar7);
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_2,(iterator *)&m_2), bVar2) {
      layers = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
               google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_2);
      collectCustomLayerNamesAndDescriptions((Model *)layers,output);
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_2);
    }
  }
  else if (TVar3 == kPipelineRegressor) {
    this = CoreML::Specification::Model::pipelineregressor(model);
    pPVar6 = CoreML::Specification::PipelineRegressor::pipeline(this);
    pRVar7 = CoreML::Specification::Pipeline::models(pPVar6);
    __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar7);
    m_1 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar7);
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_1,(iterator *)&m_1), bVar2) {
      pMVar8 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_1);
      collectCustomLayerNamesAndDescriptions(pMVar8,output);
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_1);
    }
  }
  else if (TVar3 == kPipeline) {
    pPVar6 = CoreML::Specification::Model::pipeline(model);
    pRVar7 = CoreML::Specification::Pipeline::models(pPVar6);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar7);
    m = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar7);
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2,(iterator *)&m), bVar2) {
      pMVar8 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2);
      collectCustomLayerNamesAndDescriptions(pMVar8,output);
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2);
    }
  }
  else {
    pRStack_80 = getNNSpec(model);
    if (pRStack_80 != (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)0x0) {
      for (layer._4_4_ = 0; iVar1 = layer._4_4_,
          iVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                  size(pRStack_80), iVar1 < iVar4; layer._4_4_ = layer._4_4_ + 1) {
        local_90 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                   operator[](pRStack_80,layer._4_4_);
        LVar5 = CoreML::Specification::NeuralNetworkLayer::layer_case(local_90);
        if (LVar5 == kCustom) {
          pCVar9 = CoreML::Specification::NeuralNetworkLayer::custom(local_90);
          __x = CoreML::Specification::CustomLayerParams::classname_abi_cxx11_(pCVar9);
          pCVar9 = CoreML::Specification::NeuralNetworkLayer::custom(local_90);
          __y = CoreML::Specification::CustomLayerParams::description_abi_cxx11_(pCVar9);
          std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>(&local_d0,__x,__y)
          ;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(output,&local_d0);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_d0);
        }
      }
    }
  }
  return;
}

Assistant:

inline void collectCustomLayerNamesAndDescriptions(const Specification::Model &model, std::vector<StringPair> *output) {

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        default:
            auto layers = getNNSpec(model);
            if (layers) {
                for (int i =0; i< layers->size(); i++){
                    const Specification::NeuralNetworkLayer& layer = (*layers)[i];
                    if (layer.layer_case() == Specification::NeuralNetworkLayer::kCustom) {
                        output->push_back(std::make_pair(layer.custom().classname(), layer.custom().description()));
                    }
                }
            }
            break;
        }
}